

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_crc32(uchar *data,size_t length)

{
  uint local_1c;
  ulong uStack_18;
  uint r;
  size_t length_local;
  uchar *data_local;
  
  local_1c = 0xffffffff;
  length_local = (size_t)data;
  for (uStack_18 = length; 7 < uStack_18; uStack_18 = uStack_18 - 8) {
    local_1c = lodepng_crc32_table7[(uint)*(byte *)length_local ^ local_1c & 0xff] ^
               lodepng_crc32_table6[(uint)*(byte *)(length_local + 1) ^ local_1c >> 8 & 0xff] ^
               lodepng_crc32_table5[(uint)*(byte *)(length_local + 2) ^ local_1c >> 0x10 & 0xff] ^
               lodepng_crc32_table4[(uint)*(byte *)(length_local + 3) ^ local_1c >> 0x18] ^
               lodepng_crc32_table3[*(byte *)(length_local + 4)] ^
               lodepng_crc32_table2[*(byte *)(length_local + 5)] ^
               lodepng_crc32_table1[*(byte *)(length_local + 6)] ^
               lodepng_crc32_table0[*(byte *)(length_local + 7)];
    length_local = length_local + 8;
  }
  while (uStack_18 != 0) {
    local_1c = lodepng_crc32_table0[(local_1c ^ *(byte *)length_local) & 0xff] ^ local_1c >> 8;
    uStack_18 = uStack_18 - 1;
    length_local = length_local + 1;
  }
  return local_1c ^ 0xffffffff;
}

Assistant:

unsigned lodepng_crc32(const unsigned char* data, size_t length) {
  /*Using the Slicing by Eight algorithm*/
  unsigned r = 0xffffffffu;
  while(length >= 8) {
    r = lodepng_crc32_table7[(data[0] ^ (r & 0xffu))] ^
        lodepng_crc32_table6[(data[1] ^ ((r >> 8) & 0xffu))] ^
        lodepng_crc32_table5[(data[2] ^ ((r >> 16) & 0xffu))] ^
        lodepng_crc32_table4[(data[3] ^ ((r >> 24) & 0xffu))] ^
        lodepng_crc32_table3[data[4]] ^
        lodepng_crc32_table2[data[5]] ^
        lodepng_crc32_table1[data[6]] ^
        lodepng_crc32_table0[data[7]];
    data += 8;
    length -= 8;
  }
  while(length--) {
    r = lodepng_crc32_table0[(r ^ *data++) & 0xffu] ^ (r >> 8);
  }
  return r ^ 0xffffffffu;
}